

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::IntegralType::getDefaultValueImpl
          (ConstantValue *__return_storage_ptr__,IntegralType *this)

{
  bool bVar1;
  SVInt local_20;
  
  bVar1 = Type::isEnum(&this->super_Type);
  if (bVar1) {
    Type::getDefaultValue
              (__return_storage_ptr__,(Type *)this[1].super_Type.super_Symbol.originatingSyntax);
  }
  else {
    if (this->isFourState == true) {
      SVInt::createFillX(&local_20,this->bitWidth,this->isSigned);
    }
    else {
      SVInt::SVInt(&local_20,this->bitWidth,0,this->isSigned);
    }
    std::
    variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
    ::variant<slang::SVInt,void,void,slang::SVInt,void>
              ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                *)__return_storage_ptr__,&local_20);
    SVInt::~SVInt(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue IntegralType::getDefaultValueImpl() const {
    if (isEnum())
        return as<EnumType>().baseType.getDefaultValue();

    if (isFourState)
        return SVInt::createFillX(bitWidth, isSigned);
    else
        return SVInt(bitWidth, 0, isSigned);
}